

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O3

void __thiscall QAbstractAnimation::setCurrentTime(QAbstractAnimation *this,int msecs)

{
  QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
  *this_00;
  QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
  *this_01;
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  parameter_type pVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  
  lVar4 = *(long *)(this + 8);
  if (msecs < 1) {
    msecs = 0;
  }
  uVar6 = (**(code **)(*(long *)this + 0x60))();
  if ((*(long **)(lVar4 + 0x48) != (long *)0x0) && (**(long **)(lVar4 + 0x48) != 0)) {
    QBindingStorage::registerDependency_helper
              ((QBindingStorage *)(lVar4 + 0x40),(QUntypedPropertyData *)(lVar4 + 0x88));
  }
  iVar1 = *(int *)(lVar4 + 0x88);
  uVar10 = 0xffffffff;
  if (-1 < iVar1) {
    uVar10 = iVar1 * uVar6;
  }
  if ((int)uVar6 < 1) {
    uVar10 = uVar6;
  }
  uVar5 = msecs;
  if ((int)uVar10 < msecs) {
    uVar5 = uVar10;
  }
  if (uVar10 == 0xffffffff) {
    uVar5 = msecs;
  }
  uVar9 = (ulong)uVar5;
  this_00 = (QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
             *)(lVar4 + 0x80);
  QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
  ::removeBindingUnlessInWrapper(this_00);
  uVar2 = *(uint *)(lVar4 + 0x80);
  *(uint *)(lVar4 + 0x80) = uVar5;
  pVar7 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
          ::value((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                   *)(lVar4 + 0x7c));
  iVar3 = *(int *)(lVar4 + 0x8c);
  iVar8 = 0;
  if (0 < (int)uVar6) {
    iVar8 = (int)uVar5 / (int)uVar6;
  }
  this_01 = (QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
             *)(lVar4 + 0x8c);
  if (iVar8 == iVar1) {
    uVar9 = 0;
    if (0 < (int)uVar6) {
      uVar9 = (ulong)uVar6;
    }
    *(int *)(lVar4 + 0x84) = (int)uVar9;
    iVar8 = 1;
    if (1 < iVar1) {
      iVar8 = iVar1;
    }
    iVar8 = iVar8 + -1;
  }
  else if (pVar7 == Forward) {
    if (0 < (int)uVar6) {
      uVar9 = (long)(int)uVar5 % (long)(int)uVar6 & 0xffffffff;
    }
    *(int *)(lVar4 + 0x84) = (int)uVar9;
  }
  else {
    if (0 < (int)uVar6) {
      uVar9 = (ulong)((int)(uVar5 - 1) % (int)uVar6 + 1);
    }
    *(uint *)(lVar4 + 0x84) = (uint)uVar9;
    iVar8 = iVar8 - (uint)((uint)uVar9 == uVar6);
  }
  (this_01->super_QPropertyData<int>).val = iVar8;
  (**(code **)(*(long *)this + 0x68))(this,uVar9);
  iVar1 = (this_01->super_QPropertyData<int>).val;
  pVar7 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
          ::value((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                   *)(lVar4 + 0x7c));
  uVar6 = (this_00->super_QPropertyData<int>).val;
  if (iVar1 != iVar3) {
    QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
    ::notify(this_01);
  }
  if (uVar2 != uVar6) {
    QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
    ::notify(this_00);
  }
  if (((pVar7 != Forward) || (uVar6 != uVar10)) && (pVar7 != Backward || uVar6 != 0)) {
    return;
  }
  stop(this);
  return;
}

Assistant:

void QAbstractAnimation::setCurrentTime(int msecs)
{
    Q_D(QAbstractAnimation);
    msecs = qMax(msecs, 0);

    // Calculate new time and loop.
    const int dura = duration();
    const int totalLoopCount = d->loopCount;
    const int totalDura = dura <= 0 ? dura : ((totalLoopCount < 0) ? -1 : dura * totalLoopCount);
    if (totalDura != -1)
        msecs = qMin(totalDura, msecs);

    d->totalCurrentTime.removeBindingUnlessInWrapper();

    const int oldCurrentTime = d->totalCurrentTime.valueBypassingBindings();
    d->totalCurrentTime.setValueBypassingBindings(msecs);

    QAbstractAnimation::Direction currentDirection = d->direction;

    // Update new values.
    const int oldLoop = d->currentLoop.valueBypassingBindings();
    int newCurrentLoop = (dura <= 0) ? 0 : (msecs / dura);
    if (newCurrentLoop == totalLoopCount) {
        //we're at the end
        d->currentTime = qMax(0, dura);
        newCurrentLoop = qMax(0, totalLoopCount - 1);
    } else {
        if (currentDirection == Forward) {
            d->currentTime = (dura <= 0) ? msecs : (msecs % dura);
        } else {
            d->currentTime = (dura <= 0) ? msecs : ((msecs - 1) % dura) + 1;
            if (d->currentTime == dura)
                newCurrentLoop = newCurrentLoop - 1;
        }
    }
    d->currentLoop.setValueBypassingBindings(newCurrentLoop);

    // this is a virtual function, so it can update the properties as well
    updateCurrentTime(d->currentTime);

    // read the property values again
    newCurrentLoop = d->currentLoop.valueBypassingBindings();
    currentDirection = d->direction;
    const int newTotalCurrentTime = d->totalCurrentTime.valueBypassingBindings();

    if (newCurrentLoop != oldLoop)
        d->currentLoop.notify();

    /* Notify before calling stop: As seen in tst_QSequentialAnimationGroup::clear
     * we might delete the animation when stop is called. Thus after stop no member
     * of the object must be used anymore.
     */
    if (oldCurrentTime != newTotalCurrentTime)
        d->totalCurrentTime.notify();
    // All animations are responsible for stopping the animation when their
    // own end state is reached; in this case the animation is time driven,
    // and has reached the end.
    if ((currentDirection == Forward && newTotalCurrentTime == totalDura)
        || (currentDirection == Backward && newTotalCurrentTime == 0)) {
        stop();
    }
}